

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_mk_len_0_to_4(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  size_t i;
  size_t sVar2;
  uint h;
  
  h = 9;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    seed = seed * -0x3361d2af + (int)s[sVar2];
    h = h ^ seed;
  }
  uVar1 = mur((uint32_t)len,h);
  uVar1 = mur(seed,uVar1);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static inline uint32_t farmhash32_mk_len_0_to_4(const char *s, size_t len, uint32_t seed) {
  uint32_t b = seed;
  uint32_t c = 9;
  size_t i;
  for (i = 0; i < len; i++) {
    signed char v = s[i];
    b = b * c1 + v;
    c ^= b;
  }
  return fmix(mur(b, mur(len, c)));
}